

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_img_stats_float
              (float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngoodpix,
              float *minvalue,float *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  undefined8 unaff_RBX;
  int *in_RSI;
  double *in_RDI;
  undefined8 *in_R8;
  int *in_R9;
  long unaff_R14;
  long unaff_retaddr;
  float *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xnoise;
  double xsigma;
  double xmean;
  float maxval;
  float minval;
  long ngood;
  double *in_stack_00000098;
  double *in_stack_000000a0;
  double *in_stack_000000a8;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined8 local_48;
  
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = 0;
  if ((in_stack_00000010 != (undefined8 *)0x0) || (in_stack_00000018 != (undefined8 *)0x0)) {
    FnMeanSigma_float((float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,0,0.0
                      ,(long *)0x0,(double *)0x0,(double *)0x0,in_R9);
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = local_48;
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      *in_stack_00000010 = uVar5;
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      *in_stack_00000018 = uVar4;
    }
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    FnNoise1_float(in_stack_00000008,unaff_retaddr,unaff_R14,(int)((ulong)unaff_RBX >> 0x20),
                   (float)unaff_RBX,in_RDI,in_RSI);
    *in_stack_00000020 = uVar3;
  }
  if (((in_R9 != (int *)0x0) || (in_stack_00000008 != (float *)0x0)) || (xnoise3 != 0.0)) {
    FnNoise5_float((float *)CONCAT44(nullcheck,nullvalue),(long)ngoodpix,(long)minvalue,ngood._4_4_,
                   (float)ngood,_maxval,(float *)xmean,array,in_stack_00000098,in_stack_000000a0,
                   in_stack_000000a8,(int *)maxvalue);
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = local_48;
    }
    if (in_R9 != (int *)0x0) {
      *in_R9 = in_stack_ffffffffffffffb4;
    }
    if (in_stack_00000008 != (float *)0x0) {
      *in_stack_00000008 = in_stack_ffffffffffffffb0;
    }
    if (xnoise5 != 0.0) {
      *(undefined8 *)xnoise5 = uVar2;
    }
    if (xnoise3 != 0.0) {
      *(undefined8 *)xnoise3 = uVar1;
    }
    if (xnoise2 != 0.0) {
      *(undefined8 *)xnoise2 = 0;
    }
  }
  return *(int *)xnoise;
}

Assistant:

int fits_img_stats_float(float *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	float *minvalue,    /* returned minimum non-null value in the array */
	float *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input float image.
*/
{
	long ngood;
	float minval, maxval;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_float(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_float(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_float(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}